

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satcheck.c
# Opt level: O0

parasail_result_t *
parasail_nw_stats_diag_avx2_256_sat
          (char *s1,int s1Len,char *s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  int iVar1;
  int in_stack_00000934;
  int in_stack_00000938;
  int in_stack_0000093c;
  char *in_stack_00000940;
  int in_stack_0000094c;
  char *in_stack_00000950;
  int in_stack_00000a6c;
  int in_stack_00000a70;
  int in_stack_00000a74;
  char *in_stack_00000a78;
  int in_stack_00000a84;
  char *in_stack_00000a88;
  int in_stack_00000c74;
  int in_stack_00000c78;
  int in_stack_00000c7c;
  char *in_stack_00000c80;
  int in_stack_00000c8c;
  char *in_stack_00000c90;
  parasail_matrix_t *in_stack_ffffffffffffffc0;
  undefined8 local_38;
  parasail_result_t *result;
  int gap_local;
  int open_local;
  int s2Len_local;
  char *s2_local;
  int s1Len_local;
  char *s1_local;
  
  local_38 = parasail_nw_stats_diag_avx2_256_8
                       (in_stack_00000c90,in_stack_00000c8c,in_stack_00000c80,in_stack_00000c7c,
                        in_stack_00000c78,in_stack_00000c74,in_stack_ffffffffffffffc0);
  iVar1 = parasail_result_is_saturated(local_38);
  if (iVar1 != 0) {
    parasail_result_free(local_38);
    local_38 = parasail_nw_stats_diag_avx2_256_16
                         (in_stack_00000a88,in_stack_00000a84,in_stack_00000a78,in_stack_00000a74,
                          in_stack_00000a70,in_stack_00000a6c,in_stack_ffffffffffffffc0);
  }
  iVar1 = parasail_result_is_saturated(local_38);
  if (iVar1 != 0) {
    parasail_result_free(local_38);
    local_38 = parasail_nw_stats_diag_avx2_256_32
                         (in_stack_00000950,in_stack_0000094c,in_stack_00000940,in_stack_0000093c,
                          in_stack_00000938,in_stack_00000934,in_stack_ffffffffffffffc0);
  }
  return local_38;
}

Assistant:

parasail_result_t* parasail_nw_stats_diag_avx2_256_sat(
        const char * const restrict s1, const int s1Len,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        const parasail_matrix_t *matrix)
{
    parasail_result_t * result = NULL;

    result = parasail_nw_stats_diag_avx2_256_8(s1, s1Len, s2, s2Len, open, gap, matrix);
    if (parasail_result_is_saturated(result)) {
        parasail_result_free(result);
        result = parasail_nw_stats_diag_avx2_256_16(s1, s1Len, s2, s2Len, open, gap, matrix);
    }
    if (parasail_result_is_saturated(result)) {
        parasail_result_free(result);
        result = parasail_nw_stats_diag_avx2_256_32(s1, s1Len, s2, s2Len, open, gap, matrix);
    }

    return result;
}